

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_isSealed(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_frozen)

{
  JSValue obj_00;
  JSValue JVar1;
  int iVar2;
  JSValue *in_R8;
  int in_R9D;
  JSAtom prop;
  JSPropertyDescriptor desc;
  int res;
  int flags;
  uint32_t i;
  uint32_t len;
  JSPropertyEnum *props;
  JSObject *p;
  JSValue obj;
  undefined4 in_stack_00000088;
  JSContext *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint local_90;
  uint local_88;
  uint local_84;
  long local_80;
  uint local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  iVar2 = JS_IsObject(*in_R8);
  if (iVar2 == 0) {
    local_30 = 1;
    local_28 = 1;
  }
  else {
    iVar2 = JS_GetOwnPropertyNamesInternal
                      ((JSContext *)desc.setter.u.ptr,(JSPropertyEnum **)desc.getter.tag,
                       (uint32_t *)desc.getter.u.ptr,(JSObject *)desc.value.tag,desc.value.u._4_4_);
    if (iVar2 == 0) {
      for (local_88 = 0; local_88 < local_84; local_88 = local_88 + 1) {
        in_stack_ffffffffffffff34 = *(undefined4 *)(local_80 + 4 + (ulong)local_88 * 8);
        iVar2 = JS_GetOwnPropertyInternal
                          ((JSContext *)this_val.u.ptr,(JSPropertyDescriptor *)ctx,
                           (JSObject *)CONCAT44(argc,in_stack_00000088),argv._4_4_);
        if (iVar2 < 0) {
          js_free_prop_enum((JSContext *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (JSPropertyEnum *)in_stack_ffffffffffffff28,0);
          local_30 = 0;
          local_28 = 6;
          goto LAB_001aa713;
        }
        if ((iVar2 != 0) &&
           ((js_free_desc((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                          ,(JSPropertyDescriptor *)in_stack_ffffffffffffff28),
            (in_stack_ffffffffffffff38 & 1) != 0 ||
            ((in_R9D != 0 && ((in_stack_ffffffffffffff38 & 2) != 0)))))) {
          local_90 = 0;
          goto LAB_001aa671;
        }
      }
      obj_00.u._4_4_ = in_stack_ffffffffffffff34;
      obj_00.u.int32 = in_stack_ffffffffffffff30;
      obj_00.tag._0_4_ = in_stack_ffffffffffffff38;
      obj_00.tag._4_4_ = in_stack_ffffffffffffff3c;
      local_90 = JS_IsExtensible(in_stack_ffffffffffffff28,obj_00);
      if ((int)local_90 < 0) {
        local_30 = 0;
        local_28 = 6;
      }
      else {
        local_90 = local_90 ^ 1;
LAB_001aa671:
        js_free_prop_enum((JSContext *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                          ,(JSPropertyEnum *)in_stack_ffffffffffffff28,0);
        local_30 = (uint)(local_90 != 0);
        uStack_2c = uStack_c;
        local_28 = 1;
      }
    }
    else {
      local_30 = 0;
      local_28 = 6;
    }
  }
LAB_001aa713:
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_object_isSealed(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int is_frozen)
{
    JSValueConst obj = argv[0];
    JSObject *p;
    JSPropertyEnum *props;
    uint32_t len, i;
    int flags, res;
    
    if (!JS_IsObject(obj))
        return JS_TRUE;

    p = JS_VALUE_GET_OBJ(obj);
    flags = JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK;
    if (JS_GetOwnPropertyNamesInternal(ctx, &props, &len, p, flags))
        return JS_EXCEPTION;

    for(i = 0; i < len; i++) {
        JSPropertyDescriptor desc;
        JSAtom prop = props[i].atom;

        res = JS_GetOwnPropertyInternal(ctx, &desc, p, prop);
        if (res < 0)
            goto exception;
        if (res) {
            js_free_desc(ctx, &desc);
            if ((desc.flags & JS_PROP_CONFIGURABLE)
            ||  (is_frozen && (desc.flags & JS_PROP_WRITABLE))) {
                res = FALSE;
                goto done;
            }
        }
    }
    res = JS_IsExtensible(ctx, obj);
    if (res < 0)
        return JS_EXCEPTION;
    res ^= 1;
done:        
    js_free_prop_enum(ctx, props, len);
    return JS_NewBool(ctx, res);

exception:
    js_free_prop_enum(ctx, props, len);
    return JS_EXCEPTION;
}